

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.hpp
# Opt level: O2

void __thiscall Item::~Item(Item *this)

{
  (this->super_GreenCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_00116290;
  std::__cxx11::string::~string((string *)&this->cardText);
  std::__cxx11::string::~string((string *)&this->name);
  GreenCard::~GreenCard(&this->super_GreenCard);
  return;
}

Assistant:

virtual ~Item() {}